

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O1

void stbtt__dict_get_ints(stbtt__buf *b,int key,int outcount,stbtt_uint32 *out)

{
  uint uVar1;
  uchar *puVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  stbtt_uint32 sVar6;
  uint uVar7;
  byte bVar8;
  uint uVar9;
  int iVar10;
  long lVar11;
  long unaff_R12;
  ulong uVar12;
  uchar *unaff_R13;
  stbtt__buf operands;
  stbtt__buf local_40;
  
  b->cursor = b->size >> 0x1f & b->size;
  do {
    uVar1 = b->cursor;
    iVar5 = b->size;
    if (iVar5 <= (int)uVar1) {
      if (iVar5 < 0) {
        unaff_R13 = (uchar *)0x0;
      }
      else {
        unaff_R13 = b->data;
      }
      unaff_R12 = 0;
      break;
    }
    bVar3 = true;
    uVar7 = uVar1;
    do {
      puVar2 = b->data;
      if (puVar2[(int)uVar7] < 0x1c) {
        if (bVar3) {
          b->cursor = uVar7 + 1;
          bVar8 = puVar2[(int)uVar7];
          goto LAB_00213209;
        }
        break;
      }
      if ((bool)(~bVar3 | puVar2[(int)uVar7] != 0x1e)) {
        stbtt__cff_int(b);
      }
      else {
        iVar10 = uVar7 + 1;
        if (iVar5 < (int)(uVar7 + 1)) {
          iVar10 = iVar5;
        }
        if ((int)uVar7 < -1) {
          iVar10 = iVar5;
        }
        b->cursor = iVar10;
        lVar11 = 0;
        while ((long)iVar5 - (long)iVar10 != lVar11) {
          b->cursor = iVar10 + 1 + (int)lVar11;
          lVar4 = lVar11 + iVar10;
          if (((~puVar2[lVar4] & 0xf) == 0) || (lVar11 = lVar11 + 1, (puVar2[lVar4] & 0xf0) == 0xf0)
             ) break;
        }
      }
      uVar7 = b->cursor;
      iVar5 = b->size;
      bVar3 = (int)uVar7 < iVar5;
    } while ((int)uVar7 < iVar5);
    bVar8 = 0;
LAB_00213209:
    if (bVar8 == 0xc) {
      iVar10 = b->cursor;
      uVar9 = 0x100;
      if (iVar10 < iVar5) {
        b->cursor = iVar10 + 1;
        uVar9 = b->data[iVar10] | 0x100;
      }
    }
    else {
      uVar9 = (uint)bVar8;
    }
    if (uVar9 == key) {
      if (((int)(uVar7 - uVar1 | uVar1) < 0) || (iVar5 < (int)uVar7 || iVar5 < (int)uVar1)) {
        unaff_R13 = (uchar *)0x0;
        unaff_R12 = 0;
      }
      else {
        unaff_R13 = b->data + uVar1;
        unaff_R12 = (ulong)(uVar7 - uVar1) << 0x20;
      }
    }
  } while (uVar9 != key);
  if ((0 < outcount) &&
     (local_40.size = (int)((ulong)unaff_R12 >> 0x20), (int)unaff_R12 < local_40.size)) {
    uVar12 = 1;
    local_40.data = unaff_R13;
    local_40._8_8_ = unaff_R12;
    do {
      sVar6 = stbtt__cff_int(&local_40);
      out[uVar12 - 1] = sVar6;
      if ((uint)outcount <= uVar12) {
        return;
      }
      uVar12 = uVar12 + 1;
    } while (local_40.cursor < local_40.size);
  }
  return;
}

Assistant:

static void stbtt__dict_get_ints(stbtt__buf *b, int key, int outcount, stbtt_uint32 *out)
{
   int i;
   stbtt__buf operands = stbtt__dict_get(b, key);
   for (i = 0; i < outcount && operands.cursor < operands.size; i++)
      out[i] = stbtt__cff_int(&operands);
}